

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O1

void __thiscall TPZAcademicGeoMesh::CheckConsistency(TPZAcademicGeoMesh *this,TPZGeoMesh *mesh)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  TPZGeoEl **ppTVar7;
  int i;
  long lVar8;
  undefined **ppuVar9;
  TPZGeoEl *pTVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  TPZGeoElSide gelside;
  TPZFNMatrix<6,_double> axes;
  REAL detjac;
  TPZManVector<double,_3> normal;
  TPZFNMatrix<4,_double> jacinv;
  TPZFNMatrix<4,_double> jac;
  TPZManVector<double,_3> x;
  TPZVec<double> local_398;
  double adStack_378 [2];
  TPZGeoElSide local_368;
  TPZChunkVector<TPZGeoEl_*,_10> *local_350;
  pointer_____offset_0x18___ *local_348;
  TPZFMatrix<double> local_340;
  double adStack_2b0 [7];
  long local_278;
  int64_t local_270;
  _func_int **local_268;
  _func_int **local_260;
  double *local_258;
  _func_int **local_250;
  _func_int **local_248;
  _func_int **local_240;
  double *local_238;
  _func_int **local_230;
  double *local_228;
  TPZGeoEl *local_220;
  REAL local_218;
  TPZManVector<double,_3> local_210;
  TPZFMatrix<double> local_1d8;
  double adStack_148 [5];
  TPZFMatrix<double> local_120;
  double adStack_90 [5];
  TPZManVector<double,_3> local_68;
  
  local_278 = (mesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if (0 < local_278) {
    local_350 = &(mesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
    local_228 = adStack_2b0;
    local_238 = adStack_90;
    local_258 = adStack_148;
    ppuVar9 = &PTR__TPZGeoElSide_01920090;
    local_230 = (_func_int **)&PTR__TPZFMatrix_018ab3b0;
    local_248 = (_func_int **)&PTR__TPZFNMatrix_018ab0c0;
    local_250 = (_func_int **)&PTR__TPZFMatrix_018a08f0;
    local_260 = (_func_int **)&PTR__TPZFNMatrix_018a0600;
    local_348 = &PTR_PTR_018ab378;
    local_270 = 0;
    local_268 = (_func_int **)&PTR__TPZGeoElSide_01920090;
    local_240 = (_func_int **)&PTR__TPZManVector_0183cde8;
    do {
      ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](local_350,local_270);
      pTVar10 = *ppTVar7;
      iVar4 = (**(code **)(*(long *)pTVar10 + 0xf0))(pTVar10);
      if (0 < iVar4) {
        iVar5 = 0;
        local_220 = pTVar10;
        do {
          local_368.super_TPZSavable._vptr_TPZSavable = (_func_int **)ppuVar9;
          local_368.fGeoEl = pTVar10;
          local_368.fSide = iVar5;
          iVar6 = TPZGeoElSide::Dimension(&local_368);
          if (iVar6 == 2) {
            if (local_368.fGeoEl == (TPZGeoEl *)0x0) {
              local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
              local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
                   CONCAT44(local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol._4_4_,
                            0xffffffff);
              local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = (_func_int **)ppuVar9;
            }
            else {
              (**(code **)(*(long *)local_368.fGeoEl + 0x188))
                        (&local_340,local_368.fGeoEl,local_368.fSide);
            }
            if (((TPZGeoEl *)local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow ==
                 local_368.fGeoEl) &&
               ((int)local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol == local_368.fSide))
            {
              TPZVec<double>::TPZVec(&local_398,0);
              local_398._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01843b78;
              local_398.fNElements = 2;
              local_398.fNAlloc = 0;
              adStack_378[0] = 0.0;
              adStack_378[1] = 0.0;
              local_398.fStore = adStack_378;
              TPZGeoElSide::CenterPoint(&local_368,&local_398);
              local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
              local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
              local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
              local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
              local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = local_230;
              local_340.fElem = local_228;
              local_340.fGiven = local_228;
              local_340.fSize = 6;
              TPZVec<int>::TPZVec(&local_340.fPivot.super_TPZVec<int>,0);
              pp_Var3 = local_240;
              pp_Var2 = local_250;
              local_340.fPivot.super_TPZVec<int>._vptr_TPZVec = local_240;
              local_340.fPivot.super_TPZVec<int>.fStore = local_340.fPivot.fExtAlloc;
              local_340.fPivot.super_TPZVec<int>.fNElements = 0;
              local_340.fPivot.super_TPZVec<int>.fNAlloc = 0;
              local_340.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
              local_340.fWork.fStore = (double *)0x0;
              local_340.fWork.fNElements = 0;
              local_340.fWork.fNAlloc = 0;
              local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = local_248;
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = local_250;
              local_120.fElem = local_238;
              local_120.fGiven = local_238;
              local_120.fSize = 4;
              TPZVec<int>::TPZVec(&local_120.fPivot.super_TPZVec<int>,0);
              pp_Var1 = local_260;
              local_120.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Var3;
              local_120.fPivot.super_TPZVec<int>.fStore = local_120.fPivot.fExtAlloc;
              local_120.fPivot.super_TPZVec<int>.fNElements = 0;
              local_120.fPivot.super_TPZVec<int>.fNAlloc = 0;
              local_120.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
              local_120.fWork.fStore = (double *)0x0;
              local_120.fWork.fNElements = 0;
              local_120.fWork.fNAlloc = 0;
              local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = local_260;
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = pp_Var2;
              local_1d8.fElem = local_258;
              local_1d8.fGiven = local_258;
              local_1d8.fSize = 4;
              TPZVec<int>::TPZVec(&local_1d8.fPivot.super_TPZVec<int>,0);
              local_1d8.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Var3;
              local_1d8.fPivot.super_TPZVec<int>.fStore = local_1d8.fPivot.fExtAlloc;
              local_1d8.fPivot.super_TPZVec<int>.fNElements = 0;
              local_1d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
              local_1d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
              local_1d8.fWork.fStore = (double *)0x0;
              local_1d8.fWork.fNElements = 0;
              local_1d8.fWork.fNAlloc = 0;
              local_1d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable = pp_Var1;
              TPZGeoElSide::Jacobian
                        (&local_368,&local_398,&local_120,&local_340,&local_218,&local_1d8);
              local_210.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
              TPZManVector<double,_3>::TPZManVector(&local_68,3,(double *)&local_210);
              TPZGeoElSide::X(&local_368,&local_398,&local_68.super_TPZVec<double>);
              TPZManVector<double,_3>::TPZManVector(&local_210,3);
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *local_210.super_TPZVec<double>.fStore =
                   ABS(local_340.fElem[local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] *
                       local_340.fElem
                       [local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 1] -
                       local_340.fElem
                       [local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2] *
                       local_340.fElem
                       [(long)(local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1)]);
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 3)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_210.super_TPZVec<double>.fStore[1] =
                   ABS(-*local_340.fElem *
                       local_340.fElem
                       [local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2 + 1] +
                       local_340.fElem
                       [local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 2] *
                       local_340.fElem[1]);
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_210.super_TPZVec<double>.fStore[2] =
                   ABS(*local_340.fElem *
                       local_340.fElem
                       [(long)(local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1)] -
                       local_340.fElem[local_340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] *
                       local_340.fElem[1]);
              lVar8 = 0;
              iVar6 = 0;
              dVar11 = 0.0;
              dVar13 = 1.0;
              do {
                dVar12 = local_68.super_TPZVec<double>.fStore[lVar8];
                dVar14 = dVar12;
                if (dVar13 <= dVar12) {
                  dVar14 = dVar13;
                }
                if (dVar12 <= dVar11) {
                  dVar12 = dVar11;
                }
                iVar6 = iVar6 + (uint)(1e-06 < local_210.super_TPZVec<double>.fStore[lVar8]);
                lVar8 = lVar8 + 1;
                dVar11 = dVar12;
                dVar13 = dVar14;
              } while (lVar8 != 3);
              if (iVar6 != 1) {
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAcademicGeoMesh.cpp"
                           ,0x1ba);
              }
              if ((1e-06 < dVar14) && (dVar12 < 0.999999)) {
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAcademicGeoMesh.cpp"
                           ,0x1bd);
              }
              TPZManVector<double,_3>::~TPZManVector(&local_210);
              TPZManVector<double,_3>::~TPZManVector(&local_68);
              TPZFMatrix<double>::~TPZFMatrix(&local_1d8,&PTR_PTR_018a08b8);
              TPZFMatrix<double>::~TPZFMatrix(&local_120,&PTR_PTR_018a08b8);
              TPZFMatrix<double>::~TPZFMatrix(&local_340,local_348);
              pTVar10 = local_220;
              ppuVar9 = local_268;
              if (local_398.fStore == adStack_378) {
                local_398.fStore = (double *)0x0;
              }
              local_398.fNAlloc = 0;
              local_398._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
              if (local_398.fStore != (double *)0x0) {
                operator_delete__(local_398.fStore);
              }
            }
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar4);
      }
      local_270 = local_270 + 1;
    } while (local_270 != local_278);
  }
  return;
}

Assistant:

void TPZAcademicGeoMesh::CheckConsistency(TPZGeoMesh *mesh)
{
    int64_t nel = mesh->NElements();
    for(int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = mesh->ElementVec()[el];
        int nsides = gel->NSides();
        for(int is=0; is<nsides; is++) {
            TPZGeoElSide gelside(gel,is);
            if(gelside.Dimension() != 2) {
                continue;
            }
            if(gelside.Neighbour() != gelside) {
                continue;
            }
            TPZManVector<REAL,2> xi(2,0.);
            gelside.CenterPoint(xi);
            TPZFNMatrix<6,REAL> axes(2,3);
            TPZFNMatrix<4,REAL> jac(2,2),jacinv(2,2);
            REAL detjac;
            gelside.Jacobian(xi, jac, axes, detjac, jacinv);
            TPZManVector<REAL,3> x(3,0.);
            gelside.X(xi, x);
            TPZManVector<REAL,3> normal(3);
            normal[0] = fabs(axes(0,1)*axes(1,2)-axes(0,2)*axes(1,1));
            normal[1] = fabs(-axes(0,0)*axes(1,2)+axes(0,2)*axes(1,0));
            normal[2] = fabs(axes(0,0)*axes(1,1)-axes(0,1)*axes(1,0));
            REAL tol = 1.e-6;
            REAL xmin = 1., xmax = 0.;
            int numtol = 0;
            for(int i=0; i<3; i++) {
                if(xmin > x[i]) xmin = x[i];
                if(xmax < x[i]) {
                    xmax = x[i];
                }
                if(normal[i] > tol) {
                    numtol++;
                }
            }
            if(numtol != 1) {
                DebugStop();
            }
            if(xmin > tol && xmax < 1.-tol) {
                DebugStop();
            }
        }
    }
}